

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xout.h
# Opt level: O0

ostream * operator<<(ostream *__cout,_xout_color c)

{
  char *apcStack_250 [56];
  char *palette [16];
  ostream *__cout_local;
  _xout_color c_local;
  
  palette[0xf] = (char *)__cout;
  memcpy(apcStack_250 + 0x37,&PTR_anon_var_dwarf_2684_001ae540,0x80);
  if ((c.m_c < 0x30) || (0x39 < c.m_c)) {
    if ((0x40 < c.m_c) && (c.m_c < 0x47)) {
      printf("%s",palette[(long)(int)(c.m_c - 0x37) + -1]);
    }
  }
  else {
    printf("%s",palette[(long)(int)(c.m_c - 0x30) + -1]);
  }
  return (ostream *)palette[0xf];
}

Assistant:

inline std::ostream& operator<<(std::ostream& __cout, ispring::_xout_color c) {
	const char* palette[] = {
		"\x1b[30m",
		"\x1b[34m",
		"\x1b[32m",
		"\x1b[36m",
		"\x1b[31m",
		"\x1b[35m",
		"\x1b[33m",
		"\x1b[37m",
		"\x1b[90m",
		"\x1b[94m",
		"\x1b[92m",
		"\x1b[96m",
		"\x1b[91m",
		"\x1b[95m",
		"\x1b[93m",
		"\x1b[97m",
	};
	if ('0' <= c.m_c && c.m_c <= '9') {
		printf("%s", palette[c.m_c - 48]);
	} else if ('A' <= c.m_c && c.m_c <= 'F') {
		printf("%s", palette[c.m_c - 65 + 10]);
	}
	return __cout;
}